

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_optional.h
# Opt level: O3

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,date::character_t<char>,date::unsigned_integer_t<unsigned_char,2u,2u>,date::character_t<char>&,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               optional_t<date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
               *fmt,character_t<char> *others,
               cases_t<date::branch_t<date::aliases_t<char,_4UL,_short,_11UL>_>,_date::branch_t<date::signed_integer_t<short,_2U,_2U,_true>,_date::unsigned_integer_t<short,_2U,_2U>_>_>
               *others_1)

{
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar1;
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar2;
  value_type *pvVar3;
  size_t *psVar4;
  size_t sVar5;
  istreambuf_iterator<char,_std::char_traits<char>_> *piVar6;
  bool bVar7;
  
  piVar1 = pos->m_srcIt;
  piVar2 = pos->m_srcEnd;
  pvVar3 = pos->m_cache;
  psVar4 = pos->m_cacheSize;
  sVar5 = pos->m_position;
  bVar7 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::unsigned_integer_t<unsigned_char,2u,2u>&>
                    (pos,end,&(fmt->formatters).
                              super__Tuple_impl<0UL,_date::character_t<char>,_date::unsigned_integer_t<unsigned_char,_2U,_2U>_>
                              .super__Head_base<0UL,_date::character_t<char>,_false>._M_head_impl,
                     (unsigned_integer_t<unsigned_char,_2U,_2U> *)fmt);
  if (!bVar7) {
    piVar6 = pos->m_srcIt;
    piVar6->_M_c = piVar1->_M_c;
    piVar6->_M_sbuf = piVar1->_M_sbuf;
    piVar1 = pos->m_srcEnd;
    piVar1->_M_c = piVar2->_M_c;
    piVar1->_M_sbuf = piVar2->_M_sbuf;
    pos->m_cache = pvVar3;
    *pos->m_cacheSize = *psVar4;
    pos->m_position = sVar5;
  }
  bVar7 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,date::cases_t<date::branch_t<date::aliases_t<char,4ul,short,11ul>>,date::branch_t<date::signed_integer_t<short,2u,2u,true>,date::unsigned_integer_t<short,2u,2u>>>&>
                    (pos,end,others,others_1);
  return bVar7;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, optional_t<Formatters...>& fmt, Others&&... others)
{
    Iterator begin = pos;
    if (!read_impl(pos, end, fmt.formatters, std_impl::make_index_sequence<sizeof...(Formatters)>{}))
    {
        //! TODO: unset values of the optional formatters.
        pos = std::move(begin);
    }
    return read_impl(pos, end, std::forward<Others>(others)...);
}